

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argsman_tests.cpp
# Opt level: O0

void __thiscall argsman_tests::util_CheckValue::test_method(util_CheckValue *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  Expect *pEVar1;
  long in_FS_OFFSET;
  Expect *in_stack_ffffffffffffea38;
  Expect *in_stack_ffffffffffffea40;
  undefined7 in_stack_ffffffffffffea48;
  undefined1 in_stack_ffffffffffffea4f;
  allocator_type *in_stack_ffffffffffffea70;
  UniValue *in_stack_ffffffffffffea78;
  UniValue *in_stack_ffffffffffffea80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffea88;
  undefined1 *local_1470;
  undefined1 *local_1418;
  undefined1 *local_13c0;
  undefined1 *local_1368;
  undefined1 *local_1310;
  undefined1 *local_12b8;
  undefined1 *local_1260;
  undefined1 *local_11a8;
  util_CheckValue *this_local;
  allocator<char> local_fa9 [32];
  allocator<char> local_f89 [32];
  allocator<char> local_f69 [32];
  allocator<char> local_f49 [32];
  allocator<char> local_f29 [32];
  allocator<char> local_f09 [32];
  allocator<char> local_ee9 [32];
  undefined1 local_ec9;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined8 local_eb8;
  undefined1 local_ea9;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  undefined8 local_e98;
  undefined1 local_e8b;
  allocator<char> local_e89 [32];
  undefined1 local_e69;
  undefined8 local_e68;
  undefined8 uStack_e60;
  undefined8 local_e58;
  undefined1 local_e49;
  undefined8 local_e48;
  undefined8 uStack_e40;
  undefined8 local_e38;
  undefined1 local_e29;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined1 local_e08 [32];
  undefined1 local_de8 [256];
  undefined1 local_ce8 [32];
  undefined1 local_cc8 [256];
  undefined1 local_bc8 [32];
  undefined1 local_ba8 [256];
  undefined1 local_aa8 [32];
  undefined1 local_a88 [256];
  undefined1 local_988 [32];
  undefined1 local_968 [256];
  undefined1 local_868 [32];
  undefined1 local_848 [256];
  undefined1 local_748 [32];
  undefined1 local_728 [768];
  undefined1 local_428 [32];
  undefined1 local_408 [1024];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  UniValue::UniValue(&in_stack_ffffffffffffea38->setting);
  CheckValueTest::Expect::Expect
            ((Expect *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             &in_stack_ffffffffffffea40->setting);
  CheckValueTest::Expect::DefaultString(in_stack_ffffffffffffea38);
  CheckValueTest::Expect::DefaultInt(in_stack_ffffffffffffea38);
  CheckValueTest::Expect::DefaultBool(in_stack_ffffffffffffea38);
  local_e28 = 0;
  uStack_e20 = 0;
  local_e18 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffea38);
  pEVar1 = CheckValueTest::Expect::List
                     ((Expect *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffea40);
  CheckValueTest::CheckValue(&this->super_CheckValueTest,1,(char *)0x0,pEVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48));
  CheckValueTest::Expect::~Expect(in_stack_ffffffffffffea38);
  UniValue::~UniValue(&in_stack_ffffffffffffea38->setting);
  local_e29 = 0;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffea78,(bool *)in_stack_ffffffffffffea70);
  CheckValueTest::Expect::Expect
            ((Expect *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             &in_stack_ffffffffffffea40->setting);
  CheckValueTest::Expect::String
            ((Expect *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40);
  CheckValueTest::Expect::Int
            (in_stack_ffffffffffffea40,CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48)
            );
  CheckValueTest::Expect::Bool(in_stack_ffffffffffffea40,(bool)in_stack_ffffffffffffea4f);
  local_e48 = 0;
  uStack_e40 = 0;
  local_e38 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffea38);
  pEVar1 = CheckValueTest::Expect::List
                     ((Expect *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffea40);
  CheckValueTest::CheckValue(&this->super_CheckValueTest,1,"-novalue",pEVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48));
  CheckValueTest::Expect::~Expect(in_stack_ffffffffffffea38);
  UniValue::~UniValue(&in_stack_ffffffffffffea38->setting);
  local_e49 = 0;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffea78,(bool *)in_stack_ffffffffffffea70);
  CheckValueTest::Expect::Expect
            ((Expect *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             &in_stack_ffffffffffffea40->setting);
  CheckValueTest::Expect::String
            ((Expect *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40);
  CheckValueTest::Expect::Int
            (in_stack_ffffffffffffea40,CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48)
            );
  CheckValueTest::Expect::Bool(in_stack_ffffffffffffea40,(bool)in_stack_ffffffffffffea4f);
  local_e68 = 0;
  uStack_e60 = 0;
  local_e58 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffea38);
  pEVar1 = CheckValueTest::Expect::List
                     ((Expect *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffea40);
  CheckValueTest::CheckValue(&this->super_CheckValueTest,1,"-novalue=",pEVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48));
  CheckValueTest::Expect::~Expect(in_stack_ffffffffffffea38);
  UniValue::~UniValue(&in_stack_ffffffffffffea38->setting);
  local_e69 = 1;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffea78,(bool *)in_stack_ffffffffffffea70);
  CheckValueTest::Expect::Expect
            ((Expect *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             &in_stack_ffffffffffffea40->setting);
  CheckValueTest::Expect::String
            ((Expect *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40);
  CheckValueTest::Expect::Int
            (in_stack_ffffffffffffea40,CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48)
            );
  CheckValueTest::Expect::Bool(in_stack_ffffffffffffea40,(bool)in_stack_ffffffffffffea4f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea88,(char *)in_stack_ffffffffffffea80,
             (allocator<char> *)in_stack_ffffffffffffea78);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_ffffffffffffea38);
  __l._M_len = (size_type)in_stack_ffffffffffffea88;
  __l._M_array = (iterator)in_stack_ffffffffffffea80;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffea78,__l,in_stack_ffffffffffffea70);
  pEVar1 = CheckValueTest::Expect::List
                     ((Expect *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffea40);
  CheckValueTest::CheckValue(&this->super_CheckValueTest,1,"-novalue=0",pEVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffffea38);
  local_11a8 = local_408;
  do {
    local_11a8 = local_11a8 + -0x20;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffea38);
  } while (local_11a8 != local_428);
  std::allocator<char>::~allocator(local_e89);
  CheckValueTest::Expect::~Expect(in_stack_ffffffffffffea38);
  UniValue::~UniValue(&in_stack_ffffffffffffea38->setting);
  local_e8b = 0;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffea78,(bool *)in_stack_ffffffffffffea70);
  CheckValueTest::Expect::Expect
            ((Expect *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             &in_stack_ffffffffffffea40->setting);
  CheckValueTest::Expect::String
            ((Expect *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40);
  CheckValueTest::Expect::Int
            (in_stack_ffffffffffffea40,CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48)
            );
  CheckValueTest::Expect::Bool(in_stack_ffffffffffffea40,(bool)in_stack_ffffffffffffea4f);
  local_ea8 = 0;
  uStack_ea0 = 0;
  local_e98 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffea38);
  pEVar1 = CheckValueTest::Expect::List
                     ((Expect *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffea40);
  CheckValueTest::CheckValue(&this->super_CheckValueTest,1,"-novalue=1",pEVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48));
  CheckValueTest::Expect::~Expect(in_stack_ffffffffffffea38);
  UniValue::~UniValue(&in_stack_ffffffffffffea38->setting);
  local_ea9 = 0;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffea78,(bool *)in_stack_ffffffffffffea70);
  CheckValueTest::Expect::Expect
            ((Expect *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             &in_stack_ffffffffffffea40->setting);
  CheckValueTest::Expect::String
            ((Expect *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40);
  CheckValueTest::Expect::Int
            (in_stack_ffffffffffffea40,CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48)
            );
  CheckValueTest::Expect::Bool(in_stack_ffffffffffffea40,(bool)in_stack_ffffffffffffea4f);
  local_ec8 = 0;
  uStack_ec0 = 0;
  local_eb8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffea38);
  pEVar1 = CheckValueTest::Expect::List
                     ((Expect *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffea40);
  CheckValueTest::CheckValue(&this->super_CheckValueTest,1,"-novalue=2",pEVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48));
  CheckValueTest::Expect::~Expect(in_stack_ffffffffffffea38);
  UniValue::~UniValue(&in_stack_ffffffffffffea38->setting);
  local_ec9 = 1;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffea78,(bool *)in_stack_ffffffffffffea70);
  CheckValueTest::Expect::Expect
            ((Expect *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             &in_stack_ffffffffffffea40->setting);
  CheckValueTest::Expect::String
            ((Expect *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40);
  CheckValueTest::Expect::Int
            (in_stack_ffffffffffffea40,CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48)
            );
  CheckValueTest::Expect::Bool(in_stack_ffffffffffffea40,(bool)in_stack_ffffffffffffea4f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea88,(char *)in_stack_ffffffffffffea80,
             (allocator<char> *)in_stack_ffffffffffffea78);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_ffffffffffffea38);
  __l_00._M_len = (size_type)in_stack_ffffffffffffea88;
  __l_00._M_array = (iterator)in_stack_ffffffffffffea80;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffea78,__l_00,in_stack_ffffffffffffea70);
  pEVar1 = CheckValueTest::Expect::List
                     ((Expect *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffea40);
  CheckValueTest::CheckValue(&this->super_CheckValueTest,1,"-novalue=abc",pEVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffffea38);
  local_1260 = local_728;
  do {
    local_1260 = local_1260 + -0x20;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffea38);
  } while (local_1260 != local_748);
  std::allocator<char>::~allocator(local_ee9);
  CheckValueTest::Expect::~Expect(in_stack_ffffffffffffea38);
  UniValue::~UniValue(&in_stack_ffffffffffffea38->setting);
  UniValue::UniValue<const_char_(&)[1],_char[1],_true>
            (in_stack_ffffffffffffea80,(char (*) [1])in_stack_ffffffffffffea78);
  CheckValueTest::Expect::Expect
            ((Expect *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             &in_stack_ffffffffffffea40->setting);
  CheckValueTest::Expect::String
            ((Expect *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40);
  CheckValueTest::Expect::Int
            (in_stack_ffffffffffffea40,CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48)
            );
  CheckValueTest::Expect::Bool(in_stack_ffffffffffffea40,(bool)in_stack_ffffffffffffea4f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea88,(char *)in_stack_ffffffffffffea80,
             (allocator<char> *)in_stack_ffffffffffffea78);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_ffffffffffffea38);
  __l_01._M_len = (size_type)in_stack_ffffffffffffea88;
  __l_01._M_array = (iterator)in_stack_ffffffffffffea80;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffea78,__l_01,in_stack_ffffffffffffea70);
  pEVar1 = CheckValueTest::Expect::List
                     ((Expect *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffea40);
  CheckValueTest::CheckValue(&this->super_CheckValueTest,1,"-value",pEVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffffea38);
  local_12b8 = local_848;
  do {
    local_12b8 = local_12b8 + -0x20;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffea38);
  } while (local_12b8 != local_868);
  std::allocator<char>::~allocator(local_f09);
  CheckValueTest::Expect::~Expect(in_stack_ffffffffffffea38);
  UniValue::~UniValue(&in_stack_ffffffffffffea38->setting);
  UniValue::UniValue<const_char_(&)[1],_char[1],_true>
            (in_stack_ffffffffffffea80,(char (*) [1])in_stack_ffffffffffffea78);
  CheckValueTest::Expect::Expect
            ((Expect *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             &in_stack_ffffffffffffea40->setting);
  CheckValueTest::Expect::String
            ((Expect *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40);
  CheckValueTest::Expect::Int
            (in_stack_ffffffffffffea40,CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48)
            );
  CheckValueTest::Expect::Bool(in_stack_ffffffffffffea40,(bool)in_stack_ffffffffffffea4f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea88,(char *)in_stack_ffffffffffffea80,
             (allocator<char> *)in_stack_ffffffffffffea78);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_ffffffffffffea38);
  __l_02._M_len = (size_type)in_stack_ffffffffffffea88;
  __l_02._M_array = (iterator)in_stack_ffffffffffffea80;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffea78,__l_02,in_stack_ffffffffffffea70);
  pEVar1 = CheckValueTest::Expect::List
                     ((Expect *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffea40);
  CheckValueTest::CheckValue(&this->super_CheckValueTest,1,"-value=",pEVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffffea38);
  local_1310 = local_968;
  do {
    local_1310 = local_1310 + -0x20;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffea38);
  } while (local_1310 != local_988);
  std::allocator<char>::~allocator(local_f29);
  CheckValueTest::Expect::~Expect(in_stack_ffffffffffffea38);
  UniValue::~UniValue(&in_stack_ffffffffffffea38->setting);
  UniValue::UniValue<const_char_(&)[2],_char[2],_true>
            (in_stack_ffffffffffffea80,(char (*) [2])in_stack_ffffffffffffea78);
  CheckValueTest::Expect::Expect
            ((Expect *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             &in_stack_ffffffffffffea40->setting);
  CheckValueTest::Expect::String
            ((Expect *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40);
  CheckValueTest::Expect::Int
            (in_stack_ffffffffffffea40,CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48)
            );
  CheckValueTest::Expect::Bool(in_stack_ffffffffffffea40,(bool)in_stack_ffffffffffffea4f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea88,(char *)in_stack_ffffffffffffea80,
             (allocator<char> *)in_stack_ffffffffffffea78);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_ffffffffffffea38);
  __l_03._M_len = (size_type)in_stack_ffffffffffffea88;
  __l_03._M_array = (iterator)in_stack_ffffffffffffea80;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffea78,__l_03,in_stack_ffffffffffffea70);
  pEVar1 = CheckValueTest::Expect::List
                     ((Expect *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffea40);
  CheckValueTest::CheckValue(&this->super_CheckValueTest,1,"-value=0",pEVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffffea38);
  local_1368 = local_a88;
  do {
    local_1368 = local_1368 + -0x20;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffea38);
  } while (local_1368 != local_aa8);
  std::allocator<char>::~allocator(local_f49);
  CheckValueTest::Expect::~Expect(in_stack_ffffffffffffea38);
  UniValue::~UniValue(&in_stack_ffffffffffffea38->setting);
  UniValue::UniValue<const_char_(&)[2],_char[2],_true>
            (in_stack_ffffffffffffea80,(char (*) [2])in_stack_ffffffffffffea78);
  CheckValueTest::Expect::Expect
            ((Expect *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             &in_stack_ffffffffffffea40->setting);
  CheckValueTest::Expect::String
            ((Expect *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40);
  CheckValueTest::Expect::Int
            (in_stack_ffffffffffffea40,CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48)
            );
  CheckValueTest::Expect::Bool(in_stack_ffffffffffffea40,(bool)in_stack_ffffffffffffea4f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea88,(char *)in_stack_ffffffffffffea80,
             (allocator<char> *)in_stack_ffffffffffffea78);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_ffffffffffffea38);
  __l_04._M_len = (size_type)in_stack_ffffffffffffea88;
  __l_04._M_array = (iterator)in_stack_ffffffffffffea80;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffea78,__l_04,in_stack_ffffffffffffea70);
  pEVar1 = CheckValueTest::Expect::List
                     ((Expect *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffea40);
  CheckValueTest::CheckValue(&this->super_CheckValueTest,1,"-value=1",pEVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffffea38);
  local_13c0 = local_ba8;
  do {
    local_13c0 = local_13c0 + -0x20;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffea38);
  } while (local_13c0 != local_bc8);
  std::allocator<char>::~allocator(local_f69);
  CheckValueTest::Expect::~Expect(in_stack_ffffffffffffea38);
  UniValue::~UniValue(&in_stack_ffffffffffffea38->setting);
  UniValue::UniValue<const_char_(&)[2],_char[2],_true>
            (in_stack_ffffffffffffea80,(char (*) [2])in_stack_ffffffffffffea78);
  CheckValueTest::Expect::Expect
            ((Expect *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             &in_stack_ffffffffffffea40->setting);
  CheckValueTest::Expect::String
            ((Expect *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40);
  CheckValueTest::Expect::Int
            (in_stack_ffffffffffffea40,CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48)
            );
  CheckValueTest::Expect::Bool(in_stack_ffffffffffffea40,(bool)in_stack_ffffffffffffea4f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea88,(char *)in_stack_ffffffffffffea80,
             (allocator<char> *)in_stack_ffffffffffffea78);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_ffffffffffffea38);
  __l_05._M_len = (size_type)in_stack_ffffffffffffea88;
  __l_05._M_array = (iterator)in_stack_ffffffffffffea80;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffea78,__l_05,in_stack_ffffffffffffea70);
  pEVar1 = CheckValueTest::Expect::List
                     ((Expect *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffea40);
  CheckValueTest::CheckValue(&this->super_CheckValueTest,1,"-value=2",pEVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffffea38);
  local_1418 = local_cc8;
  do {
    local_1418 = local_1418 + -0x20;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffea38);
  } while (local_1418 != local_ce8);
  std::allocator<char>::~allocator(local_f89);
  CheckValueTest::Expect::~Expect(in_stack_ffffffffffffea38);
  UniValue::~UniValue(&in_stack_ffffffffffffea38->setting);
  UniValue::UniValue<const_char_(&)[4],_char[4],_true>
            (in_stack_ffffffffffffea80,(char (*) [4])in_stack_ffffffffffffea78);
  CheckValueTest::Expect::Expect
            ((Expect *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             &in_stack_ffffffffffffea40->setting);
  CheckValueTest::Expect::String
            ((Expect *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40);
  CheckValueTest::Expect::Int
            (in_stack_ffffffffffffea40,CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48)
            );
  CheckValueTest::Expect::Bool(in_stack_ffffffffffffea40,(bool)in_stack_ffffffffffffea4f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffea88,(char *)in_stack_ffffffffffffea80,
             (allocator<char> *)in_stack_ffffffffffffea78);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_ffffffffffffea38);
  __l_06._M_len = (size_type)in_stack_ffffffffffffea88;
  __l_06._M_array = (iterator)in_stack_ffffffffffffea80;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffea78,__l_06,in_stack_ffffffffffffea70);
  pEVar1 = CheckValueTest::Expect::List
                     ((Expect *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffea40);
  CheckValueTest::CheckValue(&this->super_CheckValueTest,1,"-value=abc",pEVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffffea38);
  local_1470 = local_de8;
  do {
    local_1470 = local_1470 + -0x20;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffea38);
  } while (local_1470 != local_e08);
  std::allocator<char>::~allocator(local_fa9);
  CheckValueTest::Expect::~Expect(in_stack_ffffffffffffea38);
  UniValue::~UniValue(&in_stack_ffffffffffffea38->setting);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(util_CheckValue, CheckValueTest)
{
    using M = ArgsManager;

    CheckValue(M::ALLOW_ANY, nullptr, Expect{{}}.DefaultString().DefaultInt().DefaultBool().List({}));
    CheckValue(M::ALLOW_ANY, "-novalue", Expect{false}.String("0").Int(0).Bool(false).List({}));
    CheckValue(M::ALLOW_ANY, "-novalue=", Expect{false}.String("0").Int(0).Bool(false).List({}));
    CheckValue(M::ALLOW_ANY, "-novalue=0", Expect{true}.String("1").Int(1).Bool(true).List({"1"}));
    CheckValue(M::ALLOW_ANY, "-novalue=1", Expect{false}.String("0").Int(0).Bool(false).List({}));
    CheckValue(M::ALLOW_ANY, "-novalue=2", Expect{false}.String("0").Int(0).Bool(false).List({}));
    CheckValue(M::ALLOW_ANY, "-novalue=abc", Expect{true}.String("1").Int(1).Bool(true).List({"1"}));
    CheckValue(M::ALLOW_ANY, "-value", Expect{""}.String("").Int(0).Bool(true).List({""}));
    CheckValue(M::ALLOW_ANY, "-value=", Expect{""}.String("").Int(0).Bool(true).List({""}));
    CheckValue(M::ALLOW_ANY, "-value=0", Expect{"0"}.String("0").Int(0).Bool(false).List({"0"}));
    CheckValue(M::ALLOW_ANY, "-value=1", Expect{"1"}.String("1").Int(1).Bool(true).List({"1"}));
    CheckValue(M::ALLOW_ANY, "-value=2", Expect{"2"}.String("2").Int(2).Bool(true).List({"2"}));
    CheckValue(M::ALLOW_ANY, "-value=abc", Expect{"abc"}.String("abc").Int(0).Bool(false).List({"abc"}));
}